

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgeometry.cpp
# Opt level: O2

bool __thiscall ON_Point::Read(ON_Point *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int major_version;
  int minor_version;
  int local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if ((bVar1) && (local_18[0] == 1)) {
    bVar1 = ON_BinaryArchive::ReadPoint(file,&this->point);
  }
  return bVar1;
}

Assistant:

bool ON_Point::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    rc = file.ReadPoint(point);
  }
  return rc;
}